

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSizeLong(DescriptorProto_ExtensionRange *this)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  size_t sVar4;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  DescriptorProto_ExtensionRange *this_;
  DescriptorProto_ExtensionRange *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      sStack_58 = internal::WireFormatLite::MessageSize<google::protobuf::ExtensionRangeOptions>
                            ((this->field_0)._impl_.options_);
      sStack_58 = sStack_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      iVar2 = _internal_start(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      iVar2 = _internal_end(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar4 + sStack_58;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t DescriptorProto_ExtensionRange::ByteSizeLong() const {
  const DescriptorProto_ExtensionRange& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto.ExtensionRange)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional .google.protobuf.ExtensionRangeOptions options = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional int32 start = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_start());
    }
    // optional int32 end = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_end());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}